

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O0

Vector2f Rml::CalculateSmoothscrollVelocity
                   (Vector2f target_delta,Vector2f scrolled_distance,float dp_ratio)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector2<float> VVar5;
  Vector2f VVar6;
  Vector2f VVar7;
  float local_11c;
  float local_114;
  Vector2f local_110;
  Vector2<float> local_108;
  Vector2f local_100;
  Vector2f local_f8;
  Vector2f local_f0;
  CallbackFnc local_e8;
  Vector2<float> local_e0;
  Vector2<float> local_d8;
  Vector2<float> local_d0;
  Vector2<float> local_c8;
  Vector2<float> local_c0;
  Vector2<float> local_b8;
  Vector2f velocity_square;
  Vector2f velocity_constant;
  Vector2f smooth_window;
  float local_90;
  float fStack_8c;
  Vector2f alpha_out;
  float local_78;
  float fStack_74;
  Vector2f alpha_in;
  Tween tween;
  Vector2f target_delta_signum;
  Vector2f local_50;
  Vector2f target_delta_abs;
  Vector2f local_34;
  Vector2<float> local_2c;
  float local_24;
  Vector2f VStack_20;
  float dp_ratio_local;
  Vector2f scrolled_distance_local;
  Vector2f target_delta_local;
  
  local_24 = dp_ratio;
  VStack_20 = scrolled_distance;
  scrolled_distance_local = target_delta;
  local_34 = Math::Absolute(scrolled_distance);
  local_2c = Vector2<float>::operator/(&local_34,local_24);
  VStack_20 = local_2c;
  target_delta_abs = Vector2<float>::operator/(&scrolled_distance_local,local_24);
  scrolled_distance_local = target_delta_abs;
  local_50 = Math::Absolute(target_delta_abs);
  if (scrolled_distance_local.x <= 0.0) {
    local_114 = (float)(-(uint)(scrolled_distance_local.x < 0.0) & 0xbf800000);
  }
  else {
    local_114 = 1.0;
  }
  if (scrolled_distance_local.y <= 0.0) {
    local_11c = (float)(-(uint)(scrolled_distance_local.y < 0.0) & 0xbf800000);
  }
  else {
    local_11c = 1.0;
  }
  Vector2<float>::Vector2((Vector2<float> *)&tween.callback,local_114,local_11c);
  Tween::Tween((Tween *)&alpha_in,Exponential,Out);
  VVar5 = Vector2<float>::operator/(&stack0xffffffffffffffe0,50.0);
  Vector2<float>::Vector2(&alpha_out,1.0);
  VVar6 = Math::Min<Rml::Vector2<float>>(VVar5,alpha_out);
  VVar5 = Vector2<float>::operator/(&local_50,50.0);
  Vector2<float>::Vector2(&smooth_window,1.0);
  VVar7 = Math::Min<Rml::Vector2<float>>(VVar5,smooth_window);
  local_78 = VVar6.x;
  fVar1 = Tween::operator()((Tween *)&alpha_in,local_78);
  local_90 = VVar7.x;
  fVar2 = Tween::operator()((Tween *)&alpha_in,local_90);
  fStack_74 = VVar6.y;
  fVar3 = Tween::operator()((Tween *)&alpha_in,fStack_74);
  fStack_8c = VVar7.y;
  fVar4 = Tween::operator()((Tween *)&alpha_in,fStack_8c);
  Vector2<float>::Vector2(&velocity_constant,fVar1 * 0.8 * fVar2 + 0.2,fVar3 * 0.8 * fVar4 + 0.2);
  Vector2<float>::Vector2(&velocity_square,800.0);
  local_c8.x = local_50.x;
  local_c8.y = local_50.y;
  local_c0 = operator*(0.05,local_50);
  local_d0.x = local_50.x;
  local_d0.y = local_50.y;
  local_b8 = Vector2<float>::operator*(&local_c0,local_50);
  local_e8 = tween.callback;
  local_e0 = operator*(local_24,(Vector2<float>)tween.callback);
  local_f0 = velocity_constant;
  local_d8 = Vector2<float>::operator*(&local_e0,velocity_constant);
  local_108 = local_b8;
  local_100 = Vector2<float>::operator+(&velocity_square,local_b8);
  Vector2<float>::Vector2(&local_110,10000.0);
  local_f8 = Math::Min<Rml::Vector2<float>>(local_100,local_110);
  VVar5 = Vector2<float>::operator*(&local_d8,local_f8);
  VVar6.x = VVar5.x;
  VVar6.y = VVar5.y;
  return VVar6;
}

Assistant:

static Vector2f CalculateSmoothscrollVelocity(Vector2f target_delta, Vector2f scrolled_distance, float dp_ratio)
{
	scrolled_distance = Math::Absolute(scrolled_distance) / dp_ratio;
	target_delta = target_delta / dp_ratio;

	const Vector2f target_delta_abs = Math::Absolute(target_delta);
	Vector2f target_delta_signum = {
		target_delta.x > 0.f ? 1.f : (target_delta.x < 0.f ? -1.f : 0.f),
		target_delta.y > 0.f ? 1.f : (target_delta.y < 0.f ? -1.f : 0.f),
	};

	// The window provides velocity smoothing near the start and end of the scroll.
	const Tween tween(Tween::Exponential, Tween::Out);
	const Vector2f alpha_in = Math::Min(scrolled_distance / SMOOTHSCROLL_WINDOW_SIZE, Vector2f(1.f));
	const Vector2f alpha_out = Math::Min(target_delta_abs / SMOOTHSCROLL_WINDOW_SIZE, Vector2f(1.f));
	const Vector2f smooth_window = {
		0.2f + 0.8f * tween(alpha_in.x) * tween(alpha_out.x),
		0.2f + 0.8f * tween(alpha_in.y) * tween(alpha_out.y),
	};

	const Vector2f velocity_constant = Vector2f(SMOOTHSCROLL_VELOCITY_CONSTANT);
	const Vector2f velocity_square = SMOOTHSCROLL_VELOCITY_SQUARE_FACTOR * target_delta_abs * target_delta_abs;

	// Short scrolls are dominated by the smoothed constant velocity, while the square term is added for quick longer scrolls.
	return dp_ratio * target_delta_signum * smooth_window * Math::Min(velocity_constant + velocity_square, Vector2f(SMOOTHSCROLL_MAX_VELOCITY));
}